

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O0

int enumCallBack(int index,char **buff)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  allocator local_39;
  string local_38 [8];
  string got;
  char **buff_local;
  int index_local;
  
  iVar3 = index + 1;
  pcVar1 = buff[iVar3];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"abc");
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"def");
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"xyz");
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cout,"gor wrong enum");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        goto LAB_00114e20;
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"got enum ");
  poVar4 = std::operator<<(poVar4,buff[iVar3]);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
LAB_00114e20:
  std::__cxx11::string::~string(local_38);
  return iVar3;
}

Assistant:

int enumCallBack(int index, char **buff) {
    index++;
    string got = string(buff[index]);
    if (got == "abc" || got == "def" || got == "xyz") {
        cout << "got enum " << buff[index] << endl;
    } else {
        cout << "gor wrong enum" << endl;
    }
    return index;
}